

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O1

Item * __thiscall World::add_gold_item(World *this,uint8_t worth)

{
  _Rb_tree_header *p_Var1;
  mapped_type *ppIVar2;
  mapped_type item;
  mapped_type pIVar3;
  undefined7 in_register_00000031;
  uint8_t id;
  bool bVar4;
  byte local_31;
  
  local_31 = 0x40;
  p_Var1 = &(this->_items)._M_t._M_impl.super__Rb_tree_header;
  id = '@';
  while( true ) {
    item = (mapped_type)p_Var1;
    for (pIVar3 = (mapped_type)(this->_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
        ; pIVar3 != (mapped_type)0x0;
        pIVar3 = (mapped_type)(&(pIVar3->_name)._M_dataplus)[bVar4]._M_p) {
      bVar4 = (byte)(pIVar3->_name).field_2._M_local_buf[0] < local_31;
      if (!bVar4) {
        item = pIVar3;
      }
    }
    pIVar3 = (mapped_type)p_Var1;
    if ((item != (mapped_type)p_Var1) &&
       (pIVar3 = item, local_31 < (byte)(item->_name).field_2._M_local_buf[0])) {
      item = (mapped_type)p_Var1;
      pIVar3 = (mapped_type)p_Var1;
    }
    bVar4 = true;
    if (pIVar3 == (mapped_type)p_Var1) goto LAB_001d6d5b;
    id = local_31 + 1;
    ppIVar2 = std::
              map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
              ::operator[](&this->_items,&local_31);
    if ((*ppIVar2)->_gold_value == (uint16_t)CONCAT71(in_register_00000031,worth)) break;
    local_31 = local_31 + 1;
    if (0x6f < local_31) {
LAB_001d6d5b:
      if (bVar4) {
        if (id == 'p') {
          item = (mapped_type)0x0;
        }
        else {
          item = (mapped_type)operator_new(0x40);
          ItemGolds::ItemGolds((ItemGolds *)item,id,(ushort)worth);
          add_item(this,item);
        }
      }
      return item;
    }
  }
  ppIVar2 = std::
            map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
            ::operator[](&this->_items,&local_31);
  item = *ppIVar2;
  bVar4 = false;
  goto LAB_001d6d5b;
}

Assistant:

Item* World::add_gold_item(uint8_t worth)
{
    uint8_t first_available_id = ITEM_GOLDS_START;

    // Try to find an item with the same worth
    for(uint8_t i=ITEM_GOLDS_START ; i<ITEM_GOLDS_END ; ++i)
    {
        if(_items.count(i) == 0)
            break;

        first_available_id = i+1;
        if(_items[i]->gold_value() == worth)
            return _items[i];
    }

    // If we consumed all item IDs, don't add it you fool!
    if(first_available_id == ITEM_GOLDS_END)
        return nullptr;

    return this->add_item(new ItemGolds(first_available_id, worth));
}